

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O0

void nn_sinproc_accept(nn_sinproc *self,nn_sinproc *peer)

{
  nn_fsm *in_RSI;
  nn_fsm *in_RDI;
  nn_fsm *unaff_retaddr;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  if (in_RDI[1].shutdown_fn != (nn_fsm_fn)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!self->peer",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/inproc/sinproc.c"
            ,0x76);
    fflush(_stderr);
    nn_err_abort();
  }
  in_RDI[1].shutdown_fn = (nn_fsm_fn)in_RSI;
  nn_fsm_raiseto(unaff_retaddr,in_RDI,(nn_fsm_event *)in_RSI,in_stack_ffffffffffffffec,
                 in_stack_ffffffffffffffe8,(void *)0x14d1cc);
  nn_fsm_start((nn_fsm *)0x14d1d6);
  nn_fsm_action(in_RSI,in_stack_ffffffffffffffec);
  return;
}

Assistant:

void nn_sinproc_accept (struct nn_sinproc *self, struct nn_sinproc *peer)
{
    nn_assert (!self->peer);
    self->peer = peer;

    /*  Start the connecting handshake with the peer. */
    nn_fsm_raiseto (&self->fsm, &peer->fsm, &self->event_connect,
        NN_SINPROC_SRC_PEER, NN_SINPROC_READY, self);

    /*  Notify the state machine. */
    nn_fsm_start (&self->fsm);
    nn_fsm_action (&self->fsm, NN_SINPROC_ACTION_READY);
}